

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O3

void __thiscall crnlib::mipmapped_texture::assign(mipmapped_texture *this,mip_level *pLevel)

{
  void *p;
  vector<crnlib::mip_level_*> *pvVar1;
  ulong uVar2;
  long lVar3;
  face_vec faces;
  face_vec local_38;
  elemental_vector local_28;
  
  local_28.m_p = (undefined8 *)0x0;
  local_28.m_size = 0;
  local_28.m_capacity = 0;
  elemental_vector::increase_capacity(&local_28,1,false,8,(object_mover)0x0,false);
  *(mip_level **)local_28.m_p = pLevel;
  local_28.m_size = 1;
  local_38.m_p = (vector<crnlib::mip_level_*> *)0x0;
  local_38.m_size = 0;
  local_38.m_capacity = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&local_38,1,false,0x10,(object_mover)0x0,false);
  pvVar1 = local_38.m_p;
  (local_38.m_p)->m_p = (mip_level **)0x0;
  *(undefined8 *)&(local_38.m_p)->m_size = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)local_38.m_p,local_28.m_size,false,8,(object_mover)0x0,false);
  pvVar1->m_size = local_28.m_size;
  memcpy(pvVar1->m_p,local_28.m_p,(local_28._8_8_ & 0xffffffff) << 3);
  local_38.m_size = 1;
  if ((undefined8 *)local_28.m_p != (undefined8 *)0x0) {
    crnlib_free(local_28.m_p);
  }
  assign(this,&local_38);
  pvVar1 = local_38.m_p;
  if (local_38.m_p != (vector<crnlib::mip_level_*> *)0x0) {
    uVar2 = local_38._8_8_ & 0xffffffff;
    if (uVar2 != 0) {
      lVar3 = 0;
      do {
        p = *(void **)((long)&pvVar1->m_p + lVar3);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar3 = lVar3 + 0x10;
      } while (uVar2 << 4 != lVar3);
    }
    crnlib_free(local_38.m_p);
  }
  return;
}

Assistant:

void mipmapped_texture::assign(mip_level* pLevel) {
  face_vec faces(1, mip_ptr_vec(1, pLevel));
  assign(faces);
}